

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigManager.cpp
# Opt level: O1

ChannelController *
anon_unknown.dwarf_45723b::make_basic_channel_controller
          (char *name,config_map_t *initial_cfg,Options *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ChannelController *this;
  config_map_t *pcVar3;
  mapped_type *pmVar4;
  info_map_t *info;
  size_type __dnew;
  string output;
  size_type local_70;
  key_type local_68;
  string local_48;
  
  this = (ChannelController *)operator_new(0x18);
  cali::ChannelController::ChannelController(this,name,0,initial_cfg);
  this->_vptr_ChannelController = (_func_int **)&PTR_on_create_0027b868;
  bVar2 = cali::ConfigManager::Options::is_set(opts,"output");
  if (bVar2) {
    cali::ConfigManager::Options::get_abi_cxx11_(&local_48,opts,"output","");
    pcVar3 = cali::ChannelController::config_abi_cxx11_(this);
    paVar1 = &local_68.field_2;
    local_70 = 0x16;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    local_68._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_68.field_2._M_allocated_capacity = local_70;
    builtin_strncpy(local_68._M_dataplus._M_p,"CALI_RECORDER_FILENAME",0x16);
    local_68._M_string_length = local_70;
    local_68._M_dataplus._M_p[local_70] = '\0';
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar3,&local_68);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = cali::ChannelController::config_abi_cxx11_(this);
    local_70 = 0x14;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    local_68._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_68.field_2._M_allocated_capacity = local_70;
    builtin_strncpy(local_68._M_dataplus._M_p,"CALI_REPORT_FILENAME",0x14);
    local_68._M_string_length = local_70;
    local_68._M_dataplus._M_p[local_70] = '\0';
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar3,&local_68);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = cali::ChannelController::config_abi_cxx11_(this);
    local_70 = 0x17;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    local_68._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_68.field_2._M_allocated_capacity = local_70;
    builtin_strncpy(local_68._M_dataplus._M_p,"CALI_MPIREPORT_FILENAME",0x17);
    local_68._M_string_length = local_70;
    local_68._M_dataplus._M_p[local_70] = '\0';
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pcVar3,&local_68);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar3 = cali::ChannelController::config_abi_cxx11_(this);
  cali::ConfigManager::Options::OptionsImpl::update_channel_config
            ((opts->mP).
             super___shared_ptr<cali::ConfigManager::Options::OptionsImpl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,pcVar3);
  info = cali::ChannelController::metadata_abi_cxx11_(this);
  cali::ConfigManager::Options::OptionsImpl::update_channel_metadata
            ((opts->mP).
             super___shared_ptr<cali::ConfigManager::Options::OptionsImpl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,info);
  return this;
}

Assistant:

ChannelController* make_basic_channel_controller(
    const char*                   name,
    const config_map_t&           initial_cfg,
    const ConfigManager::Options& opts
)
{
    class BasicController : public ChannelController
    {
    public:

        BasicController(const char* name, const config_map_t& initial_cfg, const ConfigManager::Options& opts)
            : ChannelController(name, 0, initial_cfg)
        {
            // Hacky way to handle "output" option
            if (opts.is_set("output")) {
                std::string output = opts.get("output");

                config()["CALI_RECORDER_FILENAME"]  = output;
                config()["CALI_REPORT_FILENAME"]    = output;
                config()["CALI_MPIREPORT_FILENAME"] = output;
            }

            opts.update_channel_config(config());
            opts.update_channel_metadata(metadata());
        }
    };

    return new BasicController(name, initial_cfg, opts);
}